

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

void replay_read_command(char *cmdtok,char **cmd,int *count,nh_cmd_arg *arg)

{
  boolean bVar1;
  int iVar2;
  char *argstr;
  int local_30;
  int n2;
  int n;
  int cmdidx;
  nh_cmd_arg *arg_local;
  int *count_local;
  char **cmd_local;
  char *cmdtok_local;
  
  if (cmdtok != (char *)0x0) {
    _n = arg;
    arg_local = (nh_cmd_arg *)count;
    count_local = (int *)cmd;
    cmd_local = (char **)cmdtok;
    iVar2 = __isoc99_sscanf(cmdtok,">%n",&local_30);
    if ((iVar2 == -1) || (local_30 == 0)) {
      parse_error("Error: Incorrect command spec\n");
    }
    iVar2 = sscan_llx((char *)((long)cmd_local + (long)local_30),&turntime);
    if (iVar2 == 0) {
      parse_error("Error: Incorrect command spec\n");
    }
    local_30 = iVar2 + local_30;
    iVar2 = __isoc99_sscanf((long)cmd_local + (long)local_30,":%x:%d",&n2,arg_local);
    if ((iVar2 < 2) || (cmdcount < n2)) {
      parse_error("Error: Incorrect command spec\n");
    }
    *(char **)count_local = commands[n2];
    argstr = next_log_token();
    bVar1 = replay_parse_arg(argstr,_n);
    if (bVar1 == '\0') {
      parse_error("Bad command argument");
    }
  }
  return;
}

Assistant:

static void replay_read_command(char *cmdtok, char **cmd, int *count,
				    struct nh_cmd_arg *arg)
{
    int cmdidx, n, n2;

    if (!cmdtok)
	return;

    if (sscanf(cmdtok, ">%n", &n) == EOF || !n)
	parse_error("Error: Incorrect command spec\n");
    n2 = sscan_llx(cmdtok + n, &turntime);
    if (!n2) parse_error("Error: Incorrect command spec\n");
    n += n2;
    if (sscanf(cmdtok + n, ":%x:%d", &cmdidx, count) < 2 || cmdidx > cmdcount)
	parse_error("Error: Incorrect command spec\n");

    *cmd = commands[cmdidx];
    
    if (!replay_parse_arg(next_log_token(), arg))
	parse_error("Bad command argument");
}